

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralizedMAAStarPlanner.cpp
# Opt level: O1

void __thiscall GeneralizedMAAStarPlanner::Plan(GeneralizedMAAStarPlanner *this)

{
  shared_ptr<JointPolicyDiscretePure> *this_00;
  long *plVar1;
  ulong uVar2;
  pointer puVar3;
  pointer puVar4;
  undefined1 auVar5 [16];
  long *plVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  ostream *poVar10;
  ulong uVar11;
  LIndex LVar12;
  undefined8 *puVar13;
  shared_count *this_01;
  pointer puVar14;
  pointer puVar15;
  double dVar16;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM2_Qb;
  bool cleanUpPPI;
  PartialPolicyPoolInterface_sharedPtr pp_p;
  PartialPolicyPoolInterface_sharedPtr poolOfNextPolicies;
  shared_ptr<PartialJointPolicyDiscretePure> jpol_sel;
  shared_ptr<PartialJointPolicyDiscretePure> bestJPol;
  PartialPolicyPoolItemInterface_sharedPtr bestRanked_ppi;
  stringstream ss;
  PartialPolicyPoolItemInterface_sharedPtr ppi;
  tms ts_after;
  tms ts_before;
  tms ts_start;
  char local_4c1;
  double local_4c0;
  long *local_4b8;
  shared_count local_4b0;
  long *local_4a8;
  shared_count sStack_4a0;
  long local_498 [2];
  long *local_488;
  shared_count local_480;
  long local_478 [2];
  shared_ptr<PartialJointPolicyDiscretePure> local_468;
  long *local_458;
  shared_count local_450;
  _func_int **local_448;
  shared_count local_440;
  _func_int **local_438;
  shared_count local_430;
  long *local_428;
  shared_count sStack_420;
  _func_int **local_418;
  shared_count asStack_410 [2];
  ofstream *local_400;
  clock_t local_3f8;
  double local_3f0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_3e8;
  string *local_3e0;
  double local_3d8;
  long *local_3d0;
  shared_count local_3c8;
  undefined1 local_3c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b0 [7];
  ios_base local_340 [264];
  string local_238;
  undefined1 local_218 [16];
  size_type local_208;
  double local_1f0;
  ios_base local_198 [264];
  tms local_90;
  tms local_70;
  tms local_50;
  
  Initialize(this);
  plVar1 = (long *)(local_3c0 + 0x10);
  local_3c0._0_8_ = plVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c0,"GMAA::Plan","");
  TimedAlgorithm::StartTimer(&this->super_TimedAlgorithm,(string *)local_3c0);
  if ((long *)local_3c0._0_8_ != plVar1) {
    operator_delete((void *)local_3c0._0_8_,local_3b0[0]._M_allocated_capacity + 1);
  }
  local_3f8 = times(&local_50);
  local_400 = this->_m_intermediateResultFile;
  times(&local_70);
  (*(this->super_TimedAlgorithm)._vptr_TimedAlgorithm[7])(&local_468,this);
  ((local_468.px)->super_PartialJointPolicy)._m_pastReward = -1.79769313486232e+308;
  (*(this->super_TimedAlgorithm)._vptr_TimedAlgorithm[5])(&local_4b8,this);
  plVar6 = local_4b8;
  iVar7 = (*(this->super_TimedAlgorithm)._vptr_TimedAlgorithm[2])(this);
  (**(code **)(*plVar6 + 0x18))(plVar6,iVar7);
  local_3e0 = &this->_m_intermediateTimingFilename;
  local_3e8 = &this->_m_expanded_childs;
  do {
    if (this->_m_deadline != 0) {
      times(&local_90);
      local_4c0 = (double)(local_90.tms_utime - local_70.tms_utime);
      lVar9 = sysconf(2);
      auVar5._8_8_ = in_XMM2_Qb;
      auVar5._0_8_ = in_XMM2_Qa;
      auVar5 = vcvtusi2sd_avx512f(auVar5,this->_m_deadline);
      if (auVar5._0_8_ < local_4c0 / (double)lVar9) {
        local_4c0 = local_4c0 / (double)lVar9;
        std::__cxx11::stringstream::stringstream((stringstream *)local_3c0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_3c0 + 0x10),"GeneralizedMAAStarPlanner::Plan() we spent ",0x2b)
        ;
        poVar10 = std::ostream::_M_insert<double>(local_4c0);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar10,"s, which is more than the deadline of ",0x26);
        poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"s, bailing out...",0x11);
        std::__cxx11::stringbuf::str();
        EDeadline::EDeadline((EDeadline *)local_218,&local_238,0.0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
        }
        puVar13 = (undefined8 *)__cxa_allocate_exception(0x30);
        *puVar13 = &PTR__E_0059bd80;
        puVar13[1] = puVar13 + 3;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(puVar13 + 1),local_218._8_8_,(pointer)(local_218._8_8_ + local_208));
        *puVar13 = &PTR__E_0059ce68;
        puVar13[5] = local_1f0;
        __cxa_throw(puVar13,&EDeadline::typeinfo,E::~E);
      }
    }
    local_3c0._0_8_ = plVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3c0,"GMAA::Plan::iteration","");
    TimedAlgorithm::StartTimer(&this->super_TimedAlgorithm,(string *)local_3c0);
    if ((long *)local_3c0._0_8_ != plVar1) {
      operator_delete((void *)local_3c0._0_8_,local_3b0[0]._M_allocated_capacity + 1);
    }
    if (this->_m_saveIntermediateTiming == true) {
      TimedAlgorithm::SaveTimers(&this->super_TimedAlgorithm,local_3e0);
    }
    if (1 < this->_m_verboseness) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\n---------------------------------------------------\n",
                 0x35);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"-->>Start of new GMAA iteration, polpool size=",0x2e);
      (**(code **)(*local_4b8 + 0x58))();
      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"<<--",4);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
    }
    (**(code **)(*local_4b8 + 0x20))(local_218);
    (**(code **)(*(_func_int **)local_218._0_8_ + 0x10))(&local_488);
    local_4c0 = (double)(**(code **)(*(_func_int **)local_218._0_8_ + 0x18))();
    uVar2 = local_488[1];
    if (2 < this->_m_verboseness) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"GMAA Selected a partial jpol of depth=",0x26);
      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," and heur. val=",0xf);
      poVar10 = std::ostream::_M_insert<double>(local_4c0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," to expand",10);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      if (3 < this->_m_verboseness) {
        (**(code **)(*(_func_int **)local_218._0_8_ + 0x10))((tms *)local_3c0);
        (**(code **)(*(long *)local_3c0._0_8_ + 0x38))();
        boost::detail::shared_count::~shared_count((shared_count *)(local_3c0 + 8));
      }
    }
    local_4c0 = local_4c0 + this->_m_slack;
    local_3d8 = this->_m_maxLowerBound;
    if (local_4c0 < local_3d8) {
      if (-1 < this->_m_verboseness) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "!!!GMAA::Plan highest upper < best found lower bound, stopping\n",0x3f);
      }
    }
    else {
      (*(this->super_TimedAlgorithm)._vptr_TimedAlgorithm[5])(&local_4a8,this);
      local_4c1 = '\x01';
      uVar8 = (*(this->super_TimedAlgorithm)._vptr_TimedAlgorithm[3])
                        (this,local_218,&local_4a8,&local_4c1);
      if ((ulong)((long)(this->_m_expanded_childs).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(this->_m_expanded_childs).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) <= uVar2) {
        local_3c0._0_8_ = (long *)0x0;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                  (local_3e8,uVar2 + 1,(value_type_conflict2 *)local_3c0);
      }
      lVar9 = (**(code **)(*local_4a8 + 0x58))();
      puVar14 = (this->_m_expanded_childs).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->_m_expanded_childs).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar14 >> 3) <= uVar2) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar2
                  );
      }
      puVar14 = puVar14 + uVar2;
      *puVar14 = *puVar14 + lVar9;
      if (local_4c1 == '\x01') {
        local_438 = (_func_int **)local_218._0_8_;
        local_430.pi_ = (sp_counted_base *)local_218._8_8_;
        if ((sp_counted_base *)local_218._8_8_ != (sp_counted_base *)0x0) {
          LOCK();
          *(int *)(local_218._8_8_ + 8) = *(int *)(local_218._8_8_ + 8) + 1;
          UNLOCK();
        }
        (**(code **)(*local_4b8 + 0x28))(local_4b8,&local_438);
        this_01 = &local_430;
      }
      else {
        local_448 = (_func_int **)local_218._0_8_;
        local_440.pi_ = (sp_counted_base *)local_218._8_8_;
        if ((sp_counted_base *)local_218._8_8_ != (sp_counted_base *)0x0) {
          LOCK();
          *(int *)(local_218._8_8_ + 8) = *(int *)(local_218._8_8_ + 8) + 1;
          UNLOCK();
        }
        (**(code **)(*local_4b8 + 0x28))(local_4b8,&local_448);
        boost::detail::shared_count::~shared_count(&local_440);
        local_418 = (_func_int **)local_218._0_8_;
        asStack_410[0].pi_ = (sp_counted_base *)local_218._8_8_;
        if ((sp_counted_base *)local_218._8_8_ != (sp_counted_base *)0x0) {
          LOCK();
          *(int *)(local_218._8_8_ + 8) = *(int *)(local_218._8_8_ + 8) + 1;
          UNLOCK();
        }
        (**(code **)(*local_4b8 + 0x40))(local_4b8,&local_418);
        this_01 = asStack_410;
      }
      boost::detail::shared_count::~shared_count(this_01);
      if ((char)uVar8 != '\0') {
        lVar9 = (**(code **)(*local_4a8 + 0x58))();
        if (lVar9 != 0) {
          (**(code **)(*local_4a8 + 0x30))(&local_458);
          (**(code **)(*local_4a8 + 0x38))();
          dVar16 = (double)(**(code **)(*local_458 + 0x18))();
          if (this->_m_maxLowerBound < dVar16) {
            this->_m_maxLowerBound = dVar16;
            local_3f0 = dVar16;
            (**(code **)(*local_458 + 0x10))((tms *)local_3c0);
            (*((local_468.px)->super_JointPolicyDiscretePure).super_JointPolicyDiscrete.
              super_JointPolicy._vptr_JointPolicy[0x16])(local_468.px,local_3c0._0_8_);
            boost::detail::shared_count::~shared_count((shared_count *)(local_3c0 + 8));
            if (1 < this->_m_verboseness) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"new bestJPol (and max. lowerbound) found! - ",0x2c);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"value v=",8)
              ;
              poVar10 = std::ostream::_M_insert<double>(local_3f0);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10," - ",3);
              (**(code **)(*local_458 + 0x10))(&local_3d0);
              (**(code **)(*local_3d0 + 0xa8))((tms *)local_3c0);
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar10,(char *)local_3c0._0_8_,local_3c0._8_8_);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
              std::ostream::put((char)poVar10);
              std::ostream::flush();
              if ((long *)local_3c0._0_8_ != plVar1) {
                operator_delete((void *)local_3c0._0_8_,local_3b0[0]._M_allocated_capacity + 1);
              }
              boost::detail::shared_count::~shared_count(&local_3c8);
            }
            if (3 < this->_m_verboseness) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"new bestJPol->SoftPrint():",0x1a);
              (*((local_468.px)->super_JointPolicyDiscretePure).super_JointPolicyDiscrete.
                super_JointPolicy._vptr_JointPolicy[6])((tms *)local_3c0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,(char *)local_3c0._0_8_,local_3c0._8_8_);
              if ((long *)local_3c0._0_8_ != plVar1) {
                operator_delete((void *)local_3c0._0_8_,local_3b0[0]._M_allocated_capacity + 1);
              }
            }
            if (this->_m_intermediateResultFile != (ofstream *)0x0) {
              times((tms *)local_3c0);
              poVar10 = std::ostream::_M_insert<long>((long)local_400);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\t",1);
              poVar10 = std::ostream::_M_insert<double>(this->_m_maxLowerBound);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
              std::ostream::put((char)poVar10);
              std::ostream::flush();
            }
            (**(code **)(*local_4b8 + 0x50))(this->_m_maxLowerBound - this->_m_slack);
          }
          boost::detail::shared_count::~shared_count(&local_450);
        }
      }
      (*(this->super_TimedAlgorithm)._vptr_TimedAlgorithm[4])
                (this->_m_maxLowerBound - this->_m_slack,this,&local_4a8,(ulong)(uVar8 & 0xff));
      local_428 = local_4a8;
      sStack_420.pi_ = sStack_4a0.pi_;
      if (sStack_4a0.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        (sStack_4a0.pi_)->use_count_ = (sStack_4a0.pi_)->use_count_ + 1;
        UNLOCK();
      }
      (**(code **)(*local_4b8 + 0x48))(local_4b8,&local_428);
      boost::detail::shared_count::~shared_count(&sStack_420);
      uVar2 = this->_m_maxJPolPoolSize;
      uVar11 = (**(code **)(*local_4b8 + 0x58))();
      if (uVar2 < uVar11) {
        LVar12 = (**(code **)(*local_4b8 + 0x58))();
        this->_m_maxJPolPoolSize = LVar12;
      }
      local_3c0._0_8_ = plVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_3c0,"GMAA::Plan::iteration","");
      TimedAlgorithm::StopTimer(&this->super_TimedAlgorithm,(string *)local_3c0);
      if ((long *)local_3c0._0_8_ != plVar1) {
        operator_delete((void *)local_3c0._0_8_,local_3b0[0]._M_allocated_capacity + 1);
      }
      if (1 < this->_m_verboseness) {
        if ((this->_m_maxLowerBound != -1.79769313486232e+308) || (NAN(this->_m_maxLowerBound))) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"--GMAA::Plan::iteration ending, polpool size=",0x2d);
          (**(code **)(*local_4b8 + 0x58))();
          poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10,", best policy found so far:",0x1b);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
          std::ostream::put(-0x50);
          poVar10 = (ostream *)std::ostream::flush();
          (*((local_468.px)->super_JointPolicyDiscretePure).super_JointPolicyDiscrete.
            super_JointPolicy._vptr_JointPolicy[0x15])((tms *)local_3c0);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,(char *)local_3c0._0_8_,local_3c0._8_8_);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
          std::ostream::put((char)poVar10);
          std::ostream::flush();
          if ((long *)local_3c0._0_8_ != plVar1) {
            operator_delete((void *)local_3c0._0_8_,local_3b0[0]._M_allocated_capacity + 1);
          }
          if (4 < this->_m_verboseness) {
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
            std::ostream::put(-0x50);
            poVar10 = (ostream *)std::ostream::flush();
            (*((local_468.px)->super_JointPolicyDiscretePure).super_JointPolicyDiscrete.
              super_JointPolicy._vptr_JointPolicy[6])((tms *)local_3c0);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar10,(char *)local_3c0._0_8_,local_3c0._8_8_);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
            std::ostream::put((char)poVar10);
            std::ostream::flush();
            if ((long *)local_3c0._0_8_ != plVar1) {
              operator_delete((void *)local_3c0._0_8_,local_3b0[0]._M_allocated_capacity + 1);
            }
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"--GMAA::Plan::iteration ending, polpool size=",0x2d);
          (**(code **)(*local_4b8 + 0x58))();
          poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10,", no complete policy found yet",0x1e);
        }
      }
      boost::detail::shared_count::~shared_count(&sStack_4a0);
    }
    boost::detail::shared_count::~shared_count(&local_480);
    boost::detail::shared_count::~shared_count((shared_count *)(local_218 + 8));
    if (local_4c0 < local_3d8) break;
    lVar9 = (**(code **)(*local_4b8 + 0x58))();
  } while (lVar9 != 0);
  this_00 = &this->_m_foundPolicy;
  boost::shared_ptr<JointPolicyDiscretePure>::operator=(this_00,&local_468);
  this->_m_expectedRewardFoundPolicy = this->_m_maxLowerBound;
  if (0 < this->_m_verboseness) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\n----GMAA::Plan ending, best policy found:----\n",0x2f);
    (*((local_468.px)->super_JointPolicyDiscretePure).super_JointPolicyDiscrete.super_JointPolicy.
      _vptr_JointPolicy[0x15])(local_3c0);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,(char *)local_3c0._0_8_,local_3c0._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," = ",3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    if ((long *)local_3c0._0_8_ != plVar1) {
      operator_delete((void *)local_3c0._0_8_,local_3b0[0]._M_allocated_capacity + 1);
    }
    if (2 < this->_m_verboseness) {
      (*(this_00->px->super_JointPolicyDiscretePure).super_JointPolicyDiscrete.super_JointPolicy.
        _vptr_JointPolicy[6])(local_3c0);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,(char *)local_3c0._0_8_,local_3c0._8_8_);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      if ((long *)local_3c0._0_8_ != plVar1) {
        operator_delete((void *)local_3c0._0_8_,local_3b0[0]._M_allocated_capacity + 1);
      }
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
    std::ostream::put(-0x50);
    std::ostream::flush();
    if (1 < this->_m_verboseness) {
      (*(this_00->px->super_JointPolicyDiscretePure).super_JointPolicyDiscrete.super_JointPolicy.
        _vptr_JointPolicy[0x14])(local_3c0);
      (**(code **)(*(long *)local_3c0._0_8_ + 0x38))();
      boost::detail::shared_count::~shared_count((shared_count *)(local_3c0 + 8));
    }
  }
  if (1 < this->_m_verboseness) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n\n ",3);
  }
  if (-1 < this->_m_verboseness) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"GMAA::Plan GMAA ENDED",0x15);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
    std::ostream::put(-0x50);
    std::ostream::flush();
  }
  if (1 < this->_m_verboseness) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n\n ",3);
  }
  local_3c0._0_8_ = plVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c0,"GMAA::Plan","");
  TimedAlgorithm::StopTimer(&this->super_TimedAlgorithm,(string *)local_3c0);
  if ((long *)local_3c0._0_8_ != plVar1) {
    operator_delete((void *)local_3c0._0_8_,local_3b0[0]._M_allocated_capacity + 1);
  }
  if (-1 < this->_m_verboseness) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Expanded nodes at different stages:\n",0x24);
    std::__cxx11::stringstream::stringstream((stringstream *)local_218);
    puVar14 = (this->_m_expanded_childs).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start;
    puVar3 = (this->_m_expanded_childs).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,"< ",2);
    if (puVar14 != puVar3) {
      do {
        if (puVar14 !=
            (this->_m_expanded_childs).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,", ",2);
        }
        std::__cxx11::stringstream::stringstream((stringstream *)local_3c0);
        std::ostream::_M_insert<unsigned_long>((ulong)(local_3c0 + 0x10));
        std::__cxx11::stringbuf::str();
        std::__cxx11::stringstream::~stringstream((stringstream *)local_3c0);
        std::ios_base::~ios_base(local_340);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_208,(char *)local_488,(long)local_480.pi_);
        if (local_488 != local_478) {
          operator_delete(local_488,local_478[0] + 1);
        }
        puVar14 = puVar14 + 1;
      } while (puVar14 != puVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208," >",2);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)local_218);
    std::ios_base::~ios_base(local_198);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,(char *)local_4a8,(long)sStack_4a0.pi_);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    if (local_4a8 != local_498) {
      operator_delete(local_4a8,local_498[0] + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Maximum number of nodes that could have been expanded:\n",0x37
              );
    std::__cxx11::stringstream::stringstream((stringstream *)local_218);
    puVar15 = (this->_m_max_expanded_childs).
              super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
              super__Vector_impl_data._M_start;
    puVar4 = (this->_m_max_expanded_childs).
             super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,"< ",2);
    if (puVar15 != puVar4) {
      do {
        if (puVar15 !=
            (this->_m_max_expanded_childs).
            super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
            super__Vector_impl_data._M_start) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,", ",2);
        }
        std::__cxx11::stringstream::stringstream((stringstream *)local_3c0);
        std::ostream::_M_insert<unsigned_long_long>((ulonglong)(local_3c0 + 0x10));
        std::__cxx11::stringbuf::str();
        std::__cxx11::stringstream::~stringstream((stringstream *)local_3c0);
        std::ios_base::~ios_base(local_340);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_208,(char *)local_488,(long)local_480.pi_);
        if (local_488 != local_478) {
          operator_delete(local_488,local_478[0] + 1);
        }
        puVar15 = puVar15 + 1;
      } while (puVar15 != puVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208," >",2);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)local_218);
    std::ios_base::~ios_base(local_198);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,(char *)local_4a8,(long)sStack_4a0.pi_);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    if (local_4a8 != local_498) {
      operator_delete(local_4a8,local_498[0] + 1);
    }
  }
  boost::detail::shared_count::~shared_count(&local_4b0);
  boost::detail::shared_count::~shared_count(&local_468.pn);
  return;
}

Assistant:

void GeneralizedMAAStarPlanner::Plan()    
{
    Initialize();

    StartTimer("GMAA::Plan");

    //stuff for timing (if used)
    tms ts_start;   //the time struct
    clock_t tck_start;  //ticks
    tck_start = times(&ts_start);
    //the intermediate timing stream
    ofstream & its = *_m_intermediateResultFile;

    tms ts_before, ts_after;
    times(&ts_before);

    boost::shared_ptr<PartialJointPolicyDiscretePure> bestJPol = NewJPol();

    bestJPol->SetPastReward(-DBL_MAX);
#if DEBUG_GMAA_POLS    
    cout << "GMAA initialized with empty policy:"<<endl;
    bestJPol->Print();
#endif

    // Setup the Policy Pool
    PartialPolicyPoolInterface_sharedPtr pp_p = NewPP(); 
    pp_p->Init( GetThisFromMostDerivedPU() ); //initialize with empty joint policy

    do
    {
        if(_m_deadline)
        {
            times(&ts_after);
            clock_t utime = ts_after.tms_utime -
                ts_before.tms_utime;
            double timeSpentInS=static_cast<double>(utime) / sysconf(_SC_CLK_TCK);
//            cout << timeSpentInS << endl;
            if(timeSpentInS>_m_deadline)
            {
                std::stringstream ss;
                ss << "GeneralizedMAAStarPlanner::Plan() we spent "
                   << timeSpentInS << "s, which is more than the deadline of "
                   << _m_deadline << "s, bailing out...";
                EDeadline e(ss.str());
                throw(e);
            }
        }

        StartTimer("GMAA::Plan::iteration");
        if(_m_saveIntermediateTiming)
            SaveTimers(_m_intermediateTimingFilename);

        if(_m_verboseness >= 2) {
            cout << "\n---------------------------------------------------\n";
            cout << "-->>Start of new GMAA iteration, polpool size="<<
                pp_p->Size()<<"<<--"<<endl;
        }

        PartialPolicyPoolItemInterface_sharedPtr ppi = pp_p->Select();
        boost::shared_ptr<PartialJointPolicyDiscretePure> jpol_sel =  ppi->GetJPol();
        double v_sel = ppi->GetValue();
        size_t depth_sel = jpol_sel->GetDepth();
        if(_m_verboseness >= 3) {
            cout << "GMAA Selected a partial jpol of depth="<< depth_sel << " and heur. val="<<v_sel<<
                " to expand" << endl;
            if(_m_verboseness >= 4) 
                ppi->GetJPol()->Print();
        }
        //cout << "SELECTed partial pol with heur. val="<<v_sel<<endl;
        
        if( (v_sel + _m_slack) < _m_maxLowerBound) //the highest upperbound < the best lower
        {
            //  1)if JPolValPool is no priority queue, this should be changed.
            if(_m_verboseness >= 0)
                cout<<"!!!GMAA::Plan highest upper < best found lower bound, stopping\n";
            break;
        }

        //poolOfNextPolicies     = {<pol,vals>} 
        //isLowerBound  = bool   - whether the vals are lower bounds to the 
        //                optimal value (i.e. value for the optimal policy)
        //<poolOfNextPolicies,isLowerBound>=ConstructAndValuateNextPolicies(ppi)

        PartialPolicyPoolInterface_sharedPtr poolOfNextPolicies = NewPP();
        bool cleanUpPPI=true;
        bool are_LBs =
            ConstructAndValuateNextPolicies(ppi,
                                            poolOfNextPolicies,
                                            cleanUpPPI);

        //this keeps track of the actually expanded *nodes*
        //however, due to our clever stuff we never exand all the nodes anymore
        //so we will need to extract the information of 'non-incremental expansion'
        //from within the CBG solver...
        if(_m_expanded_childs.size()<=depth_sel)
            _m_expanded_childs.resize(depth_sel+1,0);
        _m_expanded_childs.at(depth_sel) += poolOfNextPolicies->Size();

        //Clean up ppi - that is we remove the top element of the policy pool because that was just expanded (right?)
        if(cleanUpPPI)
            pp_p->Pop(ppi);
        else
        {
            pp_p->Pop(ppi);
            pp_p->Insert(ppi);
            
        }

#if DEBUG_GMAA4        
        if(DEBUG_GMAA4){
            cout << "--------------------------------------------------\n"<<
                    ">>>The next policies found, poolOfNextPolicies:"<<endl;
            PartialPolicyPoolInterface_sharedPtr pp_copy = NewPP();
            *pp_copy = *poolOfNextPolicies;
            while(! pp_copy->Empty())
            {
                PartialPolicyPoolItemInterface_sharedPtr it = pp_copy->Select();
                it->Print();
                cout << endl;
                pp_copy->Pop();
            }
            cout << "<<<\n---------------------------------------------"<<endl;
        }
#endif        

        //if(isLowerBound)
        //    Prune( JPolValPool, max(lowerBound) )
        if(are_LBs && poolOfNextPolicies->Size() > 0)
        {
            PartialPolicyPoolItemInterface_sharedPtr bestRanked_ppi = poolOfNextPolicies->
                GetBestRanked();
            poolOfNextPolicies->PopBestRanked();
            double bestNextVal = bestRanked_ppi->GetValue();
            if(bestNextVal > _m_maxLowerBound) //new best lowerbound (and policy) found
            {
                _m_maxLowerBound = bestNextVal;
                *bestJPol = *(bestRanked_ppi->GetJPol());
                if(_m_verboseness >= 2) {
                    cout << "new bestJPol (and max. lowerbound) found! - ";
                    cout << "value v="
                         << bestNextVal <<" - "
                         << bestRanked_ppi->GetJPol()->SoftPrintBrief() << endl;
                }
                if(_m_verboseness >= 4) 
                    cout << "new bestJPol->SoftPrint():"<<bestJPol->SoftPrint();

                //if we maintain the internal timings...
                if(_m_intermediateResultFile != 0)
                {
                    tms ts_cur;
                    clock_t tck_cur;
                    tck_cur = times(&ts_cur);
                    clock_t diff = tck_cur - tck_start;
                    its << diff << "\t" <<  _m_maxLowerBound << endl;
                }
                // prune JPolValPool
                pp_p->Prune(_m_maxLowerBound - _m_slack );
            }
        }
        SelectPoliciesToProcessFurther(poolOfNextPolicies, are_LBs, _m_maxLowerBound - _m_slack);
        pp_p->Union(poolOfNextPolicies);

        if( _m_maxJPolPoolSize < pp_p->Size())
            _m_maxJPolPoolSize = pp_p->Size();
        
        StopTimer("GMAA::Plan::iteration");
        if(_m_verboseness >= 2) { 
            if(_m_maxLowerBound==-DBL_MAX)
                cout << "--GMAA::Plan::iteration ending, polpool size="<<pp_p->Size()<<", no complete policy found yet";
            else
            {
                cout << "--GMAA::Plan::iteration ending, polpool size="<<pp_p->Size()<<", best policy found so far:";
                cout << endl << bestJPol->SoftPrintBrief()  <<endl;
                if(_m_verboseness >= 5)  
                    cout << endl << bestJPol->SoftPrint()  <<endl;
            }
        }
    } 
    while(! pp_p->Empty() ); //<- end do...while

    //we don't want to do any conversions here... takes (sometimes too much)
    //time...
    _m_foundPolicy=bestJPol;  //->ToJointPolicyPureVector());

    _m_expectedRewardFoundPolicy=_m_maxLowerBound;
    if(_m_verboseness >= 1) {
        cout << "\n----GMAA::Plan ending, best policy found:----\n";
        cout << bestJPol->SoftPrintBrief() << " = " <<endl;
        if(_m_verboseness >= 3) 
            cout << _m_foundPolicy->SoftPrint() << endl;
        cout << endl;
        if(_m_verboseness >= 2)
        {
            JPPV_sharedPtr jppv = _m_foundPolicy->ToJointPolicyPureVector();
            jppv->Print();
        }
    }
    if(_m_verboseness >= 2)    
        cout << "\n\n ";
    if(_m_verboseness >= 0)    
        cout << "GMAA::Plan GMAA ENDED"<<endl;
    if(_m_verboseness >= 2)    
        cout << "\n\n ";

    StopTimer("GMAA::Plan");

    if(_m_verboseness >= 0)    
    {
        cout << "Expanded nodes at different stages:\n"<<
            PrintTools::SoftPrintVector(_m_expanded_childs)<<endl;
        cout << "Maximum number of nodes that could have been expanded:\n"<<
            PrintTools::SoftPrintVector(_m_max_expanded_childs)<<endl;
    }
}